

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O0

Var Js::Math::Max(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  int32 iVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  Var pvVar8;
  int *piVar9;
  double value;
  double compare_1;
  uint idxArg_1;
  bool returnNaN;
  double current_1;
  uint local_70;
  int32 compare;
  uint idxArg;
  int32 current;
  double local_60;
  double result;
  ScriptContext *pSStack_50;
  bool hasOnlyIntegerArgs;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,699,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,700,"(args.Info.Count > 0)","Should always have implicit \'this\'")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSStack_50 = RecyclableObject::GetScriptContext(function);
  result._7_1_ = 0;
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x2c0,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar7 = ScriptContext::GetLibrary(pSStack_50);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetNegativeInfinite(&pJVar7->super_JavascriptLibraryBase);
  }
  else if (((uint)scriptContext & 0xffffff) == 2) {
    pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
    local_60 = JavascriptConversion::ToNumber(pvVar8,pSStack_50);
    callInfo_local = (CallInfo)JavascriptNumber::ToVarNoCheck(local_60,pSStack_50);
  }
  else {
    result._7_1_ = TaggedInt::OnlyContainsTaggedInt((Arguments *)&scriptContext);
    if (((bool)result._7_1_) && (((uint)scriptContext & 0xffffff) == 3)) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      current = TaggedInt::ToInt32(pvVar8);
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,2);
      idxArg = TaggedInt::ToInt32(pvVar8);
      piVar9 = max<int>(&current,(int *)&idxArg);
      callInfo_local = (CallInfo)TaggedInt::ToVarUnchecked(*piVar9);
    }
    else if ((bool)result._7_1_) {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      compare = TaggedInt::ToInt32(pvVar8);
      for (local_70 = 2; local_70 < ((uint)scriptContext & 0xffffff); local_70 = local_70 + 1) {
        pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,local_70);
        iVar3 = TaggedInt::ToInt32(pvVar8);
        if (compare < iVar3) {
          compare = iVar3;
        }
      }
      callInfo_local = (CallInfo)TaggedInt::ToVarUnchecked(compare);
    }
    else {
      pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,1);
      _idxArg_1 = JavascriptConversion::ToNumber(pvVar8,pSStack_50);
      BVar4 = JavascriptNumber::IsNan(_idxArg_1);
      bVar2 = BVar4 != 0;
      for (compare_1._0_4_ = 2; compare_1._0_4_ < ((uint)scriptContext & 0xffffff);
          compare_1._0_4_ = compare_1._0_4_ + 1) {
        pvVar8 = Arguments::operator[]((Arguments *)&scriptContext,compare_1._0_4_);
        value = JavascriptConversion::ToNumber(pvVar8,pSStack_50);
        BVar4 = JavascriptNumber::IsNan(value);
        if ((BVar4 != 0) || (bVar2)) {
          bVar2 = true;
        }
        else if ((((value == 0.0) && (!NAN(value))) &&
                 (BVar4 = JavascriptNumber::IsNegZero(_idxArg_1), BVar4 != 0)) ||
                (_idxArg_1 < value)) {
          _idxArg_1 = value;
        }
      }
      if (bVar2) {
        pJVar7 = ScriptContext::GetLibrary(pSStack_50);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetNaN(&pJVar7->super_JavascriptLibraryBase);
      }
      else {
        callInfo_local = (CallInfo)JavascriptNumber::ToVarNoCheck(_idxArg_1,pSStack_50);
      }
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var Math::Max(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();
        bool hasOnlyIntegerArgs = false;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetNegativeInfinite();
        }
        else if (args.Info.Count == 2)
        {
            double result = JavascriptConversion::ToNumber(args[1], scriptContext);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            hasOnlyIntegerArgs = TaggedInt::OnlyContainsTaggedInt(args);
            if (hasOnlyIntegerArgs && args.Info.Count == 3)
            {
                return TaggedInt::ToVarUnchecked(max(TaggedInt::ToInt32(args[1]), TaggedInt::ToInt32(args[2])));
            }
        }

        if (hasOnlyIntegerArgs)
        {
            int32 current = TaggedInt::ToInt32(args[1]);
            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                int32 compare = TaggedInt::ToInt32(args[idxArg]);
                if (current < compare)
                {
                    current = compare;
                }
            }

            return TaggedInt::ToVarUnchecked(current);
        }
        else
        {
            double current = JavascriptConversion::ToNumber(args[1], scriptContext);

            bool returnNaN = false;
            if (JavascriptNumber::IsNan(current))
            {
                returnNaN = true;
            }

            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                double compare = JavascriptConversion::ToNumber(args[idxArg], scriptContext);
                if (JavascriptNumber::IsNan(compare) || returnNaN) // Call ToNumber for all args
                {
                    returnNaN = true;
                }

                // In C++, -0.0f == 0.0f; however, in ES, -0.0f < 0.0f. Thus, use additional library 
                // call to test this comparison.
                else if ((compare == 0 && JavascriptNumber::IsNegZero(current)) ||
                    current < compare)
                {
                    current = compare;
                }
            }

            if (returnNaN)
            {
                return scriptContext->GetLibrary()->GetNaN();
            }

            return JavascriptNumber::ToVarNoCheck(current, scriptContext);
        }
    }